

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::TriangleInterpolationTestCase::createInstance
          (TriangleInterpolationTestCase *this,Context *context)

{
  VkPrimitiveTopology VVar1;
  uint uVar2;
  BaseRenderingTestInstance *this_00;
  
  this_00 = (BaseRenderingTestInstance *)operator_new(0x298);
  VVar1 = this->m_primitiveTopology;
  uVar2 = this->m_flags;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (this_00,context,(this->super_BaseRenderingTestCase).m_sampleCount,0x100);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00d65810;
  *(VkPrimitiveTopology *)&this_00[1].super_TestInstance._vptr_TestInstance = VVar1;
  *(byte *)((long)&this_00[1].super_TestInstance._vptr_TestInstance + 4) = (byte)uVar2 >> 1 & 1;
  this_00[1].super_TestInstance.m_context = (Context *)0x3;
  *(undefined1 *)&this_00[1].m_renderSize = 1;
  this_00[1].m_sampleCount = uVar2 >> 2 & VK_SAMPLE_COUNT_1_BIT;
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*		createInstance					(Context& context) const
								{
									return new TriangleInterpolationTestInstance(context, m_primitiveTopology, m_flags, m_sampleCount);
								}